

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  MatrixOp op_00;
  InputType inputType_;
  DataType dataType;
  Precision precision_00;
  Context *pCVar2;
  undefined8 __s;
  bool bVar3;
  int vecSize;
  int vecSize_00;
  DataType DVar4;
  TestNode *node;
  char *__rhs;
  char *pcVar5;
  ShaderMatrixCase *pSVar6;
  ShaderMatrixTests *pSVar7;
  InputTypeSpec *pIVar8;
  InputType local_770;
  InputType local_6f8;
  InputType local_6b8;
  InputType local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_531;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_510 [8];
  ShaderInput otherMatIn_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  undefined1 local_4b8 [8];
  ShaderInput voidInput;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  undefined1 local_45c [8];
  ShaderInput vec2In;
  ShaderInput vec1In;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  undefined1 local_3f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  undefined1 local_3b8 [8];
  ShaderInput otherMatIn_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_31c [8];
  ShaderInput otherMatIn;
  int otherCols;
  undefined1 local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  allocator<char> local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  string vecMatName;
  ShaderInput rowVecIn;
  DataType rowVecType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_174 [8];
  ShaderInput colVecIn;
  DataType colVecType;
  undefined1 local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_114 [8];
  ShaderInput scalarIn;
  ShaderInput matIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string baseName;
  char *precName;
  Precision precision;
  int precNdx;
  char *matTypeName;
  int numRows;
  int numCols;
  DataType matType;
  int matTypeNdx;
  TestCaseGroup *inGroup;
  int local_40;
  InputType inputType;
  int inTypeNdx;
  TestCaseGroup *opGroup;
  MatrixOp op;
  int inTypeListSize;
  InputTypeSpec *inTypeList;
  int opNdx;
  ShaderMatrixTests *this_local;
  
  inTypeList._4_4_ = 0;
  pSVar7 = this;
  while ((int)inTypeList._4_4_ < 0x13) {
    pIVar8 = init::reducedInputTypes;
    if ((init::ops[(int)inTypeList._4_4_].extendedInputTypeCases & 1U) != 0) {
      pIVar8 = init::extendedInputTypes;
    }
    bVar1 = init::ops[(int)inTypeList._4_4_].extendedInputTypeCases;
    op_00 = init::ops[(int)inTypeList._4_4_].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::ops[(int)inTypeList._4_4_].name,init::ops[(int)inTypeList._4_4_].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    for (local_40 = 0; local_40 < (int)((bVar1 & 1) * 2 + 1); local_40 = local_40 + 1) {
      inputType_ = pIVar8[local_40].type;
      _matType = node;
      if ((init::ops[(int)inTypeList._4_4_].createInputTypeGroup & 1U) != 0) {
        _matType = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)_matType,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   pIVar8[local_40].name,pIVar8[local_40].desc);
        tcu::TestNode::addChild(node,_matType);
      }
      for (numCols = 0; numCols < 9; numCols = numCols + 1) {
        dataType = init::matrixTypes[numCols];
        vecSize = glu::getDataTypeMatrixNumColumns(dataType);
        vecSize_00 = glu::getDataTypeMatrixNumRows(dataType);
        __rhs = glu::getDataTypeName(dataType);
        for (precName._4_4_ = 0; precName._4_4_ < 3; precName._4_4_ = precName._4_4_ + 1) {
          precision_00 = init::precisions[precName._4_4_];
          pcVar5 = glu::getPrecisionName(precision_00);
          baseName.field_2._8_8_ = pcVar5;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&matIn.precision,pcVar5,
                     (allocator<char> *)((long)&matIn.dataType + 3));
          std::operator+(&local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &matIn.precision,"_");
          std::operator+(&local_b8,&local_d8,__rhs);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_98,&local_b8,"_");
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&matIn.precision);
          std::allocator<char>::~allocator((allocator<char> *)((long)&matIn.dataType + 3));
          MatrixCaseUtils::ShaderInput::ShaderInput
                    ((ShaderInput *)&scalarIn.dataType,inputType_,dataType,precision_00);
          bVar3 = MatrixCaseUtils::isOperationMatrixScalar(op_00);
          if (bVar3) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_114,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,TYPE_FLOAT,
                       precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            local_139 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_138,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix-scalar case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_114,op_00,true);
            local_139 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_138);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            colVecIn.precision._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &colVecType,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix-scalar case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_114,op_00,false);
            colVecIn.precision._3_1_ = PRECISION_LOWP >> 0x18;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&colVecType);
          }
          bVar3 = MatrixCaseUtils::isOperationMatrixVector(op_00);
          if (bVar3) {
            colVecIn.dataType = glu::getDataTypeFloatVec(vecSize);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_174,(op_00 != OP_DIV) + INPUTTYPE_UNIFORM,
                       colVecIn.dataType,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            local_1b9 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar5 = glu::getDataTypeName(colVecIn.dataType);
            std::operator+(&local_1b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,pcVar5);
            std::operator+(&local_198,&local_1b8,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix-vector case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_174,op_00,true);
            local_1b9 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_198);
            std::__cxx11::string::~string((string *)&local_1b8);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            pcVar5 = glu::getDataTypeName(colVecIn.dataType);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rowVecType,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,pcVar5);
            std::operator+(&local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &rowVecType,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix-vector case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_174,op_00,false);
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_1e0);
            std::__cxx11::string::~string((string *)&rowVecType);
            DVar4 = glu::getDataTypeFloatVec(vecSize_00);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (op_00 != OP_DIV) + INPUTTYPE_UNIFORM,DVar4,precision_00);
            __s = baseName.field_2._8_8_;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2b8,(char *)__s,&local_2b9);
            std::operator+(&local_298,&local_2b8,"_");
            pcVar5 = glu::getDataTypeName(DVar4);
            std::operator+(&local_278,&local_298,pcVar5);
            std::operator+(&local_258,&local_278,"_");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,&local_258,__rhs);
            std::__cxx11::string::~string((string *)&local_258);
            std::__cxx11::string::~string((string *)&local_278);
            std::__cxx11::string::~string((string *)&local_298);
            std::__cxx11::string::~string((string *)&local_2b8);
            std::allocator<char>::~allocator(&local_2b9);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            local_2e1 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_2e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,"_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Vector-matrix case",
                       (ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (ShaderInput *)&scalarIn.dataType,op_00,true);
            local_2e1 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_2e0);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            otherMatIn.precision._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherCols,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,"_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Vector-matrix case",
                       (ShaderInput *)((long)&vecMatName.field_2 + 0xc),
                       (ShaderInput *)&scalarIn.dataType,op_00,false);
            otherMatIn.precision._3_1_ = PRECISION_LOWP >> 0x18;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&otherCols);
            std::__cxx11::string::~string((string *)local_238);
          }
          bVar3 = MatrixCaseUtils::isOperationArithmeticMatrixMatrix(op_00);
          if (bVar3) {
            for (otherMatIn.dataType = TYPE_FLOAT_VEC2; (int)otherMatIn.dataType < 5;
                otherMatIn.dataType = otherMatIn.dataType + TYPE_FLOAT) {
              local_668 = inputType_;
              if (inputType_ == INPUTTYPE_DYNAMIC) {
                local_668 = INPUTTYPE_UNIFORM;
              }
              DVar4 = glu::getDataTypeMatrix(otherMatIn.dataType,vecSize);
              MatrixCaseUtils::ShaderInput::ShaderInput
                        ((ShaderInput *)local_31c,local_668,DVar4,precision_00);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              local_361 = 1;
              pCVar2 = (this->super_TestCaseGroup).m_context;
              pcVar5 = glu::getDataTypeName(local_31c._4_4_);
              std::operator+(&local_360,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,pcVar5);
              std::operator+(&local_340,&local_360,"_vertex");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType
                         ,(ShaderInput *)local_31c,op_00,true);
              local_361 = 0;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_340);
              std::__cxx11::string::~string((string *)&local_360);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              otherMatIn_1.dataType._3_1_ = 1;
              pCVar2 = (this->super_TestCaseGroup).m_context;
              pcVar5 = glu::getDataTypeName(local_31c._4_4_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &otherMatIn_1.precision,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,pcVar5);
              std::operator+(&local_388,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &otherMatIn_1.precision,"_fragment");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType
                         ,(ShaderInput *)local_31c,op_00,false);
              otherMatIn_1.dataType._3_1_ = TYPE_INVALID >> 0x18;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_388);
              std::__cxx11::string::~string((string *)&otherMatIn_1.precision);
            }
          }
          else {
            bVar3 = MatrixCaseUtils::isOperationComponentwiseMatrixMatrix(op_00);
            if (bVar3) {
              local_6b8 = inputType_;
              if (inputType_ == INPUTTYPE_DYNAMIC) {
                local_6b8 = INPUTTYPE_UNIFORM;
              }
              MatrixCaseUtils::ShaderInput::ShaderInput
                        ((ShaderInput *)local_3b8,local_6b8,dataType,precision_00);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              local_3f9 = 1;
              pCVar2 = (this->super_TestCaseGroup).m_context;
              std::operator+(&local_3f8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,__rhs);
              std::operator+(&local_3d8,&local_3f8,"_vertex");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType
                         ,(ShaderInput *)local_3b8,op_00,true);
              local_3f9 = 0;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_3d8);
              std::__cxx11::string::~string((string *)&local_3f8);
              pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
              vec1In.dataType._3_1_ = 1;
              pCVar2 = (this->super_TestCaseGroup).m_context;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vec1In.precision,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_98,__rhs);
              std::operator+(&local_420,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &vec1In.precision,"_fragment");
              pcVar5 = (char *)std::__cxx11::string::c_str();
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar6,pCVar2,pcVar5,"Matrix-matrix case",(ShaderInput *)&scalarIn.dataType
                         ,(ShaderInput *)local_3b8,op_00,false);
              vec1In.dataType._3_1_ = TYPE_INVALID >> 0x18;
              tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
              std::__cxx11::string::~string((string *)&local_420);
              std::__cxx11::string::~string((string *)&vec1In.precision);
            }
          }
          bVar3 = MatrixCaseUtils::isOperationVectorVector(op_00);
          if (bVar3) {
            DVar4 = glu::getDataTypeFloatVec(vecSize_00);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)&vec2In.dataType,inputType_,DVar4,precision_00);
            local_6f8 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_6f8 = INPUTTYPE_UNIFORM;
            }
            DVar4 = glu::getDataTypeFloatVec(vecSize);
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_45c,local_6f8,DVar4,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_480,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Vector-vector case",(ShaderInput *)&vec2In.dataType,
                       (ShaderInput *)local_45c,op_00,true);
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_480);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            voidInput.dataType._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &voidInput.precision,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Vector-vector case",(ShaderInput *)&vec2In.dataType,
                       (ShaderInput *)local_45c,op_00,false);
            voidInput.dataType._3_1_ = TYPE_INVALID >> 0x18;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&voidInput.precision);
          }
          bVar3 = MatrixCaseUtils::isOperationUnaryAnyMatrix(op_00);
          if ((bVar3) ||
             ((bVar3 = MatrixCaseUtils::isOperationUnarySymmetricMatrix(op_00), bVar3 &&
              (vecSize == vecSize_00)))) {
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_4b8,INPUTTYPE_LAST,TYPE_LAST,PRECISION_LAST);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_4d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_4b8,op_00,true);
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_4d8);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            otherMatIn_2.dataType._3_1_ = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn_2.precision,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix case",(ShaderInput *)&scalarIn.dataType,
                       (ShaderInput *)local_4b8,op_00,false);
            otherMatIn_2.dataType._3_1_ = TYPE_INVALID >> 0x18;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&otherMatIn_2.precision);
          }
          bVar3 = MatrixCaseUtils::isOperationAssignmentAnyMatrix(op_00);
          if ((bVar3) ||
             ((bVar3 = MatrixCaseUtils::isOperationAssignmentSymmetricMatrix(op_00), bVar3 &&
              (vecSize == vecSize_00)))) {
            local_770 = inputType_;
            if (inputType_ == INPUTTYPE_DYNAMIC) {
              local_770 = INPUTTYPE_UNIFORM;
            }
            MatrixCaseUtils::ShaderInput::ShaderInput
                      ((ShaderInput *)local_510,local_770,dataType,precision_00);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            local_531 = 1;
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_530,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_vertex");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix assignment case",
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_510,op_00,true);
            local_531 = 0;
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_530);
            pSVar6 = (ShaderMatrixCase *)operator_new(0x168);
            pCVar2 = (this->super_TestCaseGroup).m_context;
            std::operator+(&local_558,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_98,"float_fragment");
            pcVar5 = (char *)std::__cxx11::string::c_str();
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar6,pCVar2,pcVar5,"Matrix assignment case",
                       (ShaderInput *)&scalarIn.dataType,(ShaderInput *)local_510,op_00,false);
            tcu::TestNode::addChild(_matType,(TestNode *)pSVar6);
            std::__cxx11::string::~string((string *)&local_558);
          }
          std::__cxx11::string::~string((string *)local_98);
        }
      }
    }
    inTypeList._4_4_ = inTypeList._4_4_ + 1;
    pSVar7 = (ShaderMatrixTests *)(ulong)inTypeList._4_4_;
  }
  return (int)pSVar7;
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		MatrixOp		op;
		bool			extendedInputTypeCases; // !< test with const and uniform types too
		bool			createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		InputType		type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_LOWP,
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_context, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}